

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

ParsedParameter * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::ParsedParameter,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::FileLoc&>
          (polymorphic_allocator<std::byte> *this,polymorphic_allocator<std::byte> *args,
          FileLoc *args_1)

{
  ParsedParameter *pPVar1;
  size_t in_RDI;
  ParsedParameter *p;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffe0;
  
  pPVar1 = allocate_object<pbrt::ParsedParameter>(in_stack_ffffffffffffffe0,in_RDI);
  construct<pbrt::ParsedParameter,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::FileLoc&>
            (this,(ParsedParameter *)args,(polymorphic_allocator<std::byte> *)args_1,(FileLoc *)p);
  return pPVar1;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }